

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_endec_filter_test.cxx
# Opt level: O0

back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
perform_encryptions<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           first,__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 last,
          back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> d_first)

{
  pointer *ppuVar1;
  undefined8 uVar2;
  bool bVar3;
  lazy_ostream *prev;
  iterator __first;
  iterator __last;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> bVar4;
  basic_cstring<const_char> local_130;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_120;
  uchar *local_100;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_f8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_f0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_e8;
  equal_coll_impl local_d9;
  assertion_result local_d8;
  basic_cstring<const_char> local_c0;
  basic_cstring<const_char> local_b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_98;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_90;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_70;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_68;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_60;
  undefined1 local_58 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> direct;
  vector<unsigned_char,_std::allocator<unsigned_char>_> filter;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> d_first_local;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  last_local;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  first_local;
  
  ppuVar1 = &direct.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
  local_68._M_current = last._M_current;
  local_60._M_current = first._M_current;
  local_70 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
  encrypt_using_filter<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (local_60,local_68,
             (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)
             local_70);
  local_90._M_current = last._M_current;
  local_88._M_current = first._M_current;
  local_98 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
  local_a0 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             encrypt_using_direct<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                       (local_88,local_90,
                        (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         )local_98);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b0,
               "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/symmetric/iostreams/rotating_endec_filter_test.cxx"
               ,0x88);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_b0,0xaf,&local_c0);
    ppuVar1 = &direct.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    local_e8._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
    local_f0._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
    local_f8._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
    local_100 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    local_58);
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              (&local_d8,&local_d9,local_e8,local_f0,local_f8,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )local_100);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_120,prev,(char (*) [1])0x37c1a9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_130,
               "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/symmetric/iostreams/rotating_endec_filter_test.cxx"
               ,0x88);
    boost::test_tools::tt_detail::report_assertion
              (&local_d8,&local_120,&local_130,0xaf,1,0xd,4,"filter.begin()","filter.end()",
               "direct.begin()","direct.end()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_120);
    boost::test_tools::assertion_result::~assertion_result(&local_d8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  ppuVar1 = &direct.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  __first = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
  __last = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ppuVar1);
  bVar4 = std::
          copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                    ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )__first._M_current,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )__last._M_current,d_first);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &direct.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)
         bVar4.container;
}

Assistant:

static Output perform_encryptions(Input first, Input last, Output d_first) {
	std::vector<std::uint8_t> filter;
	std::vector<std::uint8_t> direct;

	encrypt_using_filter(first, last, std::back_inserter(filter));
	encrypt_using_direct(first, last, std::back_inserter(direct));

	BOOST_CHECK_EQUAL_COLLECTIONS(filter.begin(), filter.end(),
	                              direct.begin(), direct.end());

	return std::copy(filter.begin(), filter.end(), d_first);
}